

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.cpp
# Opt level: O3

void __thiscall
xmrig::Pool::Pool(Pool *this,char *host,uint16_t port,char *user,char *password,int keepAlive,
                 bool tls)

{
  this->m_keepAlive = keepAlive;
  this->m_mode = MODE_POOL;
  (this->m_flags).super__Base_bitset<1UL>._M_w = 1;
  (this->m_fingerprint).m_data = (char *)0x0;
  (this->m_fingerprint).m_size = 0;
  String::String(&this->m_password,password);
  (this->m_rigId).m_data = (char *)0x0;
  (this->m_rigId).m_size = 0;
  String::String(&this->m_user,user);
  this->m_pollInterval = 1000;
  (this->m_daemon).m_tls = false;
  *(undefined8 *)&(this->m_daemon).m_scheme = 0;
  *(undefined8 *)((long)&(this->m_daemon).m_host.m_data + 4) = 0;
  *(undefined8 *)((long)&(this->m_daemon).m_host.m_size + 4) = 0;
  *(undefined8 *)((long)&(this->m_daemon).m_url.m_data + 4) = 0;
  *(undefined4 *)((long)&(this->m_daemon).m_url.m_size + 4) = 0;
  (this->m_daemon).m_port = 0xd05;
  Url::Url(&this->m_url,host,port,tls,UNSPECIFIED);
  (this->m_flags).super__Base_bitset<1UL>._M_w =
       ((this->m_flags).super__Base_bitset<1UL>._M_w & 0xfffffffffffffffd) + (ulong)tls * 2;
  return;
}

Assistant:

xmrig::Pool::Pool(const char *host, uint16_t port, const char *user, const char *password, int keepAlive, bool tls) :
    m_keepAlive(keepAlive),
    m_flags(1 << FLAG_ENABLED),
    m_password(password),
    m_user(user),
    m_pollInterval(kDefaultPollInterval),
    m_url(host, port, tls)
{
    m_flags.set(FLAG_TLS,      tls);
}